

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(int user_key_index,bool repeat)

{
  float fVar1;
  int iVar2;
  byte in_SIL;
  uint in_EDI;
  float t;
  ImGuiContext *g;
  bool local_1d;
  int in_stack_fffffffffffffff0;
  bool local_1;
  
  if ((int)in_EDI < 0) {
    local_1 = false;
  }
  else {
    local_1d = 0x1ff < in_EDI;
    if (local_1d) {
      __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0x1202,"bool ImGui::IsKeyPressed(int, bool)");
    }
    fVar1 = (GImGui->IO).KeysDownDuration[(int)in_EDI];
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      if (((in_SIL & 1) == 0) || (fVar1 <= (GImGui->IO).KeyRepeatDelay)) {
        local_1 = false;
      }
      else {
        iVar2 = GetKeyPressedAmount(in_stack_fffffffffffffff0,(float)((ulong)GImGui >> 0x20),
                                    SUB84(GImGui,0));
        local_1 = 0 < iVar2;
      }
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyPressed(int user_key_index, bool repeat)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0)
        return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[user_key_index];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(user_key_index, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}